

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O3

void __thiscall
gss::innards::HomomorphismModel::_build_distance3_graphs
          (HomomorphismModel *this,
          vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *graph_rows,
          uint size,uint *idx,bool pattern)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  BitWord BVar3;
  ulong uVar4;
  pointer pSVar5;
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  _List_node_base *p_Var10;
  int iVar11;
  SVOBitset *pSVar12;
  undefined8 uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  value_type nv;
  value_type nc;
  undefined1 local_140 [128];
  uint local_c0;
  anon_union_128_2_84168a9f_for__data local_b8;
  uint local_38;
  
  if (size != 0) {
    uVar15 = 0;
    do {
      SVOBitset::SVOBitset
                ((SVOBitset *)local_140,
                 (graph_rows->
                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                 )._M_impl.super__Vector_impl_data._M_start + this->max_graphs * uVar15);
      SVOBitset::operator|=
                ((graph_rows->
                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                 )._M_impl.super__Vector_impl_data._M_start + (this->max_graphs * uVar15 + *idx),
                 (SVOBitset *)local_140);
      uVar9 = (ulong)local_c0;
      pSVar12 = (SVOBitset *)local_140;
      if (0x10 < uVar9) {
        pSVar12 = (SVOBitset *)local_140._0_8_;
      }
      if (uVar9 != 0) {
        iVar14 = 0;
        uVar16 = 0;
LAB_0013555b:
        BVar3 = (pSVar12->_data).short_data[uVar16];
        if (BVar3 == 0) goto code_r0x00135564;
        iVar11 = 0;
        for (; (BVar3 & 1) == 0; BVar3 = BVar3 >> 1 | 0x8000000000000000) {
          iVar11 = iVar11 + 1;
        }
        if (iVar11 + 1 != iVar14) {
          iVar11 = iVar11 - iVar14;
          do {
            pSVar12 = (SVOBitset *)local_140._0_8_;
            if ((uint)uVar9 < 0x11) {
              pSVar12 = (SVOBitset *)local_140;
            }
            bVar7 = (byte)iVar11 & 0x3f;
            iVar14 = iVar11 + 0x3f;
            if (-1 < iVar11) {
              iVar14 = iVar11;
            }
            (pSVar12->_data).short_data[iVar14 >> 6] =
                 (pSVar12->_data).short_data[iVar14 >> 6] &
                 (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
            SVOBitset::SVOBitset
                      ((SVOBitset *)&local_b8,
                       (graph_rows->
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                       )._M_impl.super__Vector_impl_data._M_start + iVar11 * this->max_graphs);
            SVOBitset::operator|=
                      ((graph_rows->
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                       (this->max_graphs * uVar15 + *idx),(SVOBitset *)&local_b8);
            uVar9 = (ulong)local_38;
            uVar13 = &local_b8;
            if (0x10 < uVar9) {
              uVar13 = local_b8.short_data[0];
            }
            if (uVar9 != 0) {
              iVar14 = 0;
              uVar16 = 0;
LAB_0013563b:
              uVar4 = *(ulong *)(uVar13 + uVar16 * 8);
              if (uVar4 == 0) goto code_r0x00135644;
              iVar11 = 0;
              for (; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x8000000000000000) {
                iVar11 = iVar11 + 1;
              }
              if (iVar11 + 1 != iVar14) {
                iVar11 = iVar11 - iVar14;
                while( true ) {
                  uVar13 = local_b8.long_data;
                  if ((uint)uVar9 < 0x11) {
                    uVar13 = &local_b8;
                  }
                  bVar7 = (byte)iVar11 & 0x3f;
                  iVar14 = iVar11 + 0x3f;
                  if (-1 < iVar11) {
                    iVar14 = iVar11;
                  }
                  *(ulong *)(uVar13 + (long)(iVar14 >> 6) * 8) =
                       *(ulong *)(uVar13 + (long)(iVar14 >> 6) * 8) &
                       (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
                  pSVar5 = (graph_rows->
                           super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  SVOBitset::operator|=
                            (pSVar5 + (this->max_graphs * uVar15 + *idx),
                             pSVar5 + iVar11 * this->max_graphs);
                  uVar9 = (ulong)local_38;
                  uVar13 = &local_b8;
                  if (0x10 < uVar9) {
                    uVar13 = local_b8.long_data;
                  }
                  if (uVar9 == 0) break;
                  iVar14 = 0;
                  uVar16 = 0;
                  while (uVar4 = *(ulong *)(uVar13 + uVar16 * 8), uVar4 == 0) {
                    uVar16 = uVar16 + 1;
                    iVar14 = iVar14 + -0x40;
                    if (uVar9 == uVar16) goto LAB_0013565d;
                  }
                  iVar8 = 0;
                  for (; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x8000000000000000) {
                    iVar8 = iVar8 + 1;
                  }
                  iVar11 = iVar8 - iVar14;
                  if (iVar8 + 1 == iVar14) goto LAB_0013565d;
                }
                goto LAB_0013567a;
              }
LAB_0013565d:
              if ((anon_union_128_2_84168a9f_for__data *)local_b8.short_data[0] !=
                  (anon_union_128_2_84168a9f_for__data *)0x0 && 0x10 < local_38) {
                operator_delete__(local_b8.long_data);
              }
            }
LAB_0013567a:
            uVar9 = (ulong)local_c0;
            pSVar12 = (SVOBitset *)local_140;
            if (0x10 < uVar9) {
              pSVar12 = (SVOBitset *)local_140._0_8_;
            }
            if (uVar9 == 0) goto LAB_00135592;
            iVar14 = 0;
            uVar16 = 0;
            while (BVar3 = (pSVar12->_data).short_data[uVar16], BVar3 == 0) {
              uVar16 = uVar16 + 1;
              iVar14 = iVar14 + -0x40;
              if (uVar9 == uVar16) goto LAB_0013557d;
            }
            iVar8 = 0;
            for (; (BVar3 & 1) == 0; BVar3 = BVar3 >> 1 | 0x8000000000000000) {
              iVar8 = iVar8 + 1;
            }
            iVar11 = iVar8 - iVar14;
            if (iVar8 + 1 == iVar14) break;
          } while( true );
        }
LAB_0013557d:
        if ((SVOBitset *)local_140._0_8_ != (SVOBitset *)0x0 && 0x10 < local_c0) {
          operator_delete__((void *)local_140._0_8_);
        }
      }
LAB_00135592:
      uVar15 = uVar15 + 1;
    } while (uVar15 != size);
  }
  if (pattern) {
    _Var6._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    p_Var2 = (_List_node_base *)(local_140 + 0x10);
    local_140._0_8_ = p_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"distance3","");
    p_Var10 = (_List_node_base *)operator_new(0x30);
    uVar13 = local_140._8_8_;
    p_Var10[1]._M_next = p_Var10 + 2;
    if ((_List_node_base *)local_140._0_8_ == p_Var2) {
      p_Var10[2]._M_next = (_List_node_base *)CONCAT71(local_140._17_7_,local_140[0x10]);
      p_Var10[2]._M_prev = (_List_node_base *)local_140._24_8_;
    }
    else {
      p_Var10[1]._M_next = (_List_node_base *)local_140._0_8_;
      p_Var10[2]._M_next = (_List_node_base *)CONCAT71(local_140._17_7_,local_140[0x10]);
    }
    local_140._8_8_ = 0;
    local_140[0x10] = 0;
    p_Var10[1]._M_prev = (_List_node_base *)uVar13;
    local_140._0_8_ = p_Var2;
    std::__detail::_List_node_base::_M_hook(p_Var10);
    psVar1 = (size_t *)((long)&(_Var6._M_head_impl)->supplemental_graph_names + 0x10);
    *psVar1 = *psVar1 + 1;
    if ((_List_node_base *)local_140._0_8_ != p_Var2) {
      operator_delete((void *)local_140._0_8_,CONCAT71(local_140._17_7_,local_140[0x10]) + 1);
    }
  }
  *idx = *idx + 1;
  return;
code_r0x00135564:
  uVar16 = uVar16 + 1;
  iVar14 = iVar14 + -0x40;
  if (uVar9 == uVar16) goto LAB_0013557d;
  goto LAB_0013555b;
code_r0x00135644:
  uVar16 = uVar16 + 1;
  iVar14 = iVar14 + -0x40;
  if (uVar9 == uVar16) goto LAB_0013565d;
  goto LAB_0013563b;
}

Assistant:

auto HomomorphismModel::_build_distance3_graphs(vector<SVOBitset> & graph_rows, unsigned size, unsigned & idx,
        bool pattern) -> void
{
    for (unsigned v = 0; v < size; ++v) {
        auto nv = graph_rows[v * max_graphs + 0];
        graph_rows[v * max_graphs + idx] |= nv;
        for (auto c = nv.find_first(); c != decltype(nv)::npos; c = nv.find_first()) {
            nv.reset(c);
            auto nc = graph_rows[c * max_graphs + 0];
            graph_rows[v * max_graphs + idx] |= nc;
            for (auto w = nc.find_first(); w != decltype(nc)::npos; w = nc.find_first()) {
                nc.reset(w);
                // v--c--w so v is within distance 3 of w's neighbours
                graph_rows[v * max_graphs + idx] |= graph_rows[w * max_graphs + 0];
            }
        }
    }

    if (pattern)
        _imp->supplemental_graph_names.push_back("distance3");
    ++idx;
}